

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

bool __thiscall Js::FunctionBody::DoRedeferFunction(FunctionBody *this,uint inactiveThreshold)

{
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar1;
  EntryPointInfo *pEVar2;
  code *pcVar3;
  bool bVar4;
  ExecutionMode EVar5;
  State SVar6;
  uint32 uVar7;
  uint uVar8;
  uint uVar9;
  undefined4 *puVar10;
  FunctionInfo *pFVar11;
  void *pvVar12;
  long lVar13;
  ulong uVar14;
  FunctionEntryPointInfo *strongRef;
  long lVar15;
  bool local_31 [8];
  bool overflow;
  
  pFVar11 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if ((FunctionBody *)(pFVar11->functionBodyImpl).ptr == this) {
    if ((pFVar11->attributes & CanDefer) == None) {
      return false;
    }
    if ((this->byteCodeBlock).ptr == (ByteBlock *)0x0) {
      return false;
    }
    if (this->m_depth != 0) {
      return false;
    }
    if ((this->field_0x17d & 2) == 0) {
      bVar4 = Phases::IsEnabled((Phases *)&DAT_01599240,RedeferralPhase,
                                ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.
                                     m_utf8SourceInfo.ptr)->m_srcInfo).ptr)->sourceContextInfo).ptr)
                                ->sourceContextId,pFVar11->functionId);
      if (!bVar4) {
        pFVar11 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        uVar8 = ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
                   m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
        if (pFVar11 == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar10 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                      ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar10 = 0;
          pFVar11 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        }
        bVar4 = Phases::IsEnabled((Phases *)&DAT_0159c0e0,RedeferralPhase,uVar8,pFVar11->functionId)
        ;
        if (!bVar4) {
          uVar8 = FunctionProxy::GetCompileCount((FunctionProxy *)this);
          if (DAT_015a1ee0 <= uVar8) {
            return false;
          }
          local_31[0] = false;
          if (1 < uVar8) {
            uVar9 = JavascriptNumber::DirectPowIntInt(local_31,inactiveThreshold,uVar8);
            inactiveThreshold = 0xffffffff;
            if ((local_31[0] & 1U) == 0) {
              inactiveThreshold = uVar9;
            }
          }
          if (this->inactiveCount < inactiveThreshold) {
            return false;
          }
        }
      }
      EVar5 = FunctionExecutionStateMachine::GetExecutionMode(&this->executionState);
      pSVar1 = (this->entryPoints).ptr;
      if ((pSVar1 != (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                      *)0x0) &&
         (0 < (pSVar1->
              super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ).
              super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
              .count)) {
        lVar13 = 0;
        do {
          pEVar2 = (EntryPointInfo *)
                   (((pSVar1->
                     super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     ).
                     super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                     .buffer.ptr[lVar13].ptr)->super_RecyclerWeakReferenceBase).strongRef;
          if (pEVar2 != (EntryPointInfo *)0x0) {
            SVar6 = EntryPointInfo::GetState(pEVar2);
            if ((ProfilingInterpreter < EVar5) && (SVar6 == CodeGenPending)) {
              return false;
            }
            SVar6 = EntryPointInfo::GetState(pEVar2);
            if (SVar6 == CodeGenQueued) {
              return false;
            }
            SVar6 = EntryPointInfo::GetState(pEVar2);
            if (SVar6 == CodeGenRecorded) {
              return false;
            }
            SVar6 = EntryPointInfo::GetState(pEVar2);
            if ((SVar6 == CodeGenDone) && ((pEVar2->field_0x18 & 0x10) == 0)) {
              return false;
            }
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < (pSVar1->
                          super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          ).
                          super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                          .count);
      }
      pvVar12 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,LoopHeaderArray);
      if (pvVar12 == (void *)0x0) {
        return true;
      }
      uVar7 = GetCountField(this,LoopCount);
      if (uVar7 == 0) {
        return true;
      }
      uVar14 = 0;
      do {
        lVar13 = *(long *)((long)pvVar12 + uVar14 * 0x30);
        if ((lVar13 != 0) && (0 < *(int *)(lVar13 + 0x10))) {
          lVar15 = 0;
          do {
            pEVar2 = *(EntryPointInfo **)(*(long *)(lVar13 + 8) + lVar15 * 8);
            if (pEVar2 != (EntryPointInfo *)0x0) {
              SVar6 = EntryPointInfo::GetState(pEVar2);
              if (SVar6 == CodeGenPending) {
                return false;
              }
              SVar6 = EntryPointInfo::GetState(pEVar2);
              if (SVar6 == CodeGenQueued) {
                return false;
              }
              SVar6 = EntryPointInfo::GetState(pEVar2);
              if (SVar6 == CodeGenRecorded) {
                return false;
              }
              SVar6 = EntryPointInfo::GetState(pEVar2);
              if ((SVar6 == CodeGenDone) && ((pEVar2->field_0x18 & 0x10) == 0)) {
                return false;
              }
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 < *(int *)(lVar13 + 0x10));
        }
        uVar14 = uVar14 + 1;
        if (uVar14 == uVar7) {
          return true;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool FunctionBody::DoRedeferFunction(uint inactiveThreshold) const
    {
        if (!(this->GetFunctionInfo()->GetFunctionProxy() == this &&
              this->CanBeDeferred() &&
              this->GetByteCode() &&
              this->GetCanDefer()))
        {
            return false;
        }

        if (!PHASE_FORCE(Js::RedeferralPhase, this) && !PHASE_STRESS(Js::RedeferralPhase, this))
        {
            uint compileCount = this->GetCompileCount();
            if (compileCount >= (uint)CONFIG_FLAG(RedeferralCap))
            {
                return false;
            }
            // Redeferral threshold is k^x, where x is the number of previous compiles.
            bool overflow = false;
            uint currentThreshold = inactiveThreshold;
            if (compileCount > 1)
            {
                currentThreshold = JavascriptNumber::DirectPowIntInt(&overflow, inactiveThreshold, compileCount);
            }
            if (overflow)
            {
                currentThreshold = 0xFFFFFFFF;
            }
            if (this->GetInactiveCount() < currentThreshold)
            {
                return false;
            }
        }

        // Make sure the function won't be jitted
        bool isJitCandidate = false;
#if ENABLE_NATIVE_CODEGEN
        bool isJitModeFunction = !this->IsInterpreterExecutionMode();
        isJitCandidate = MapEntryPointsUntil([=](int index, FunctionEntryPointInfo *entryPointInfo)
        {
            if ((entryPointInfo->IsCodeGenPending() && isJitModeFunction) || entryPointInfo->IsCodeGenQueued() || entryPointInfo->IsCodeGenRecorded() || (entryPointInfo->IsCodeGenDone() && !entryPointInfo->IsNativeEntryPointProcessed()))
            {
                return true;
            }
            return false;
        });

        if (!isJitCandidate)
        {
            // Now check loop body entry points
            isJitCandidate = MapLoopHeadersUntil([=](uint loopNumber, LoopHeader* header)
            {
                return header->MapEntryPointsUntil([&](int index, LoopEntryPointInfo* entryPointInfo)
                {
                    if (entryPointInfo->IsCodeGenPending() || entryPointInfo->IsCodeGenQueued() || entryPointInfo->IsCodeGenRecorded() || (entryPointInfo->IsCodeGenDone() && !entryPointInfo->IsNativeEntryPointProcessed()))
                    {
                        return true;
                    }
                    return false;
                });
            });
        }
#endif

        return !isJitCandidate;
    }